

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O1

int Gia_ManFaultAnalyze(sat_solver *pSat,Vec_Int_t *vPars,Vec_Int_t *vMap,Vec_Int_t *vLits,int Iter)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  int Lit;
  timespec ts;
  uint local_60;
  uint local_5c;
  uint local_58;
  int local_54;
  long local_50;
  Vec_Int_t *local_48;
  timespec local_40;
  
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    local_50 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    local_50 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  if (vPars->nSize != vMap->nSize) {
    __assert_fail("Vec_IntSize(vPars) == Vec_IntSize(vMap)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                  ,0x45f,
                  "int Gia_ManFaultAnalyze(sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                 );
  }
  vLits->nSize = 0;
  local_58 = Iter;
  if (0 < vMap->nSize) {
    lVar4 = 0;
    do {
      Vec_IntPush(vLits,vMap->pArray[lVar4]);
      lVar4 = lVar4 + 1;
    } while (lVar4 < vMap->nSize);
  }
  uVar3 = (ulong)(uint)vPars->nSize;
  iVar6 = 0;
  iVar1 = 0;
  uVar5 = 0;
  local_48 = vMap;
  if (0 < vPars->nSize) {
    lVar4 = 0;
    local_5c = 0;
    iVar1 = 0;
    do {
      if (vLits->nSize <= lVar4) {
LAB_00535f7d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (vLits->pArray[lVar4] != 0) {
        if (vLits->pArray[lVar4] != 1) {
          __assert_fail("Vec_IntEntry(vLits, v) == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                        ,0x467,
                        "int Gia_ManFaultAnalyze(sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                       );
        }
        if (vPars->pArray[lVar4] < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf1,"int Abc_Var2Lit(int, int)");
        }
        local_5c = local_5c + 1;
        local_60 = vPars->pArray[lVar4] * 2;
        iVar2 = sat_solver_solve(pSat,(lit *)&local_60,(lit *)&local_5c,100,0,0,0);
        if (iVar2 == -1) {
          if (local_48->nSize <= lVar4) goto LAB_00535f7d;
          if (local_48->pArray[lVar4] != 1) {
            __assert_fail("Vec_IntEntry(vMap, v) == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                          ,0x470,
                          "int Gia_ManFaultAnalyze(sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                         );
          }
          local_48->pArray[lVar4] = 0;
          if ((int)local_60 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf4,"int Abc_LitNot(int)");
          }
          iVar1 = iVar1 + 1;
          local_60 = local_60 ^ 1;
        }
        else if (iVar2 != 0) {
          local_54 = iVar1;
          if (0 < vPars->nSize) {
            lVar7 = 0;
            do {
              if (vLits->nSize <= lVar7) goto LAB_00535f7d;
              if (vLits->pArray[lVar7] != 0) {
                iVar1 = sat_solver_var_value(pSat,vPars->pArray[lVar7]);
                if (iVar1 != 0) {
                  if (vLits->nSize <= lVar7) {
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
                  }
                  vLits->pArray[lVar7] = 0;
                }
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 < vPars->nSize);
          }
          if (vLits->nSize <= lVar4) goto LAB_00535f7d;
          iVar1 = local_54;
          if (vLits->pArray[lVar4] != 0) {
            __assert_fail("Vec_IntEntry(vLits, v) == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                          ,0x47a,
                          "int Gia_ManFaultAnalyze(sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                         );
          }
        }
      }
      lVar4 = lVar4 + 1;
      uVar3 = (ulong)vPars->nSize;
    } while (lVar4 < (long)uVar3);
    uVar5 = (ulong)local_5c;
  }
  iVar2 = local_48->nSize;
  if (0 < (long)iVar2) {
    lVar4 = 0;
    iVar6 = 0;
    do {
      iVar6 = iVar6 + (uint)(0 < local_48->pArray[lVar4]);
      lVar4 = lVar4 + 1;
    } while (iVar2 != lVar4);
  }
  printf("Iteration %3d has determined %5d (out of %5d) parameters after %6d SAT calls.  ",
         (ulong)local_58,(ulong)(uint)(iVar2 - iVar6),uVar3,uVar5);
  iVar2 = 3;
  iVar6 = clock_gettime(3,&local_40);
  if (iVar6 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  lVar4 = lVar4 + local_50;
  Abc_Print(iVar2,"%s =","Time");
  Abc_Print(iVar2,"%9.2f sec\n",(double)lVar4 / 1000000.0);
  return iVar1;
}

Assistant:

int Gia_ManFaultAnalyze( sat_solver * pSat, Vec_Int_t * vPars, Vec_Int_t * vMap, Vec_Int_t * vLits, int Iter )
{
    int nConfLimit = 100;
    int status, i, v, iVar, Lit;
    int nUnsats = 0, nRuns = 0;
    abctime clk = Abc_Clock();
    assert( Vec_IntSize(vPars) == Vec_IntSize(vMap) );
    // check presence of each variable
    Vec_IntClear( vLits );
    Vec_IntAppend( vLits, vMap );
    for ( v = 0; v < Vec_IntSize(vPars); v++ )
    {
        if ( !Vec_IntEntry(vLits, v) )
            continue;
        assert( Vec_IntEntry(vLits, v) == 1 );
        nRuns++;
        Lit = Abc_Var2Lit( Vec_IntEntry(vPars, v), 0 );
        status = sat_solver_solve( pSat, &Lit, &Lit+1, (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( status == l_Undef )
            continue;
        if ( status == l_False )
        {
            nUnsats++;
            assert( Vec_IntEntry(vMap, v) == 1 );
            Vec_IntWriteEntry( vMap, v, 0 );
            Lit = Abc_LitNot(Lit);
            //status = sat_solver_addclause( pSat, &Lit, &Lit+1 );
            //assert( status );
            continue;
        }
        Vec_IntForEachEntry( vPars, iVar, i )
            if ( Vec_IntEntry(vLits, i) && sat_solver_var_value(pSat, iVar) )
                Vec_IntWriteEntry( vLits, i, 0 );
        assert( Vec_IntEntry(vLits, v) == 0 );
    }
    printf( "Iteration %3d has determined %5d (out of %5d) parameters after %6d SAT calls.  ", Iter, Vec_IntSize(vMap) - Vec_IntCountPositive(vMap), Vec_IntSize(vPars), nRuns );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return nUnsats;
}